

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextBox.h
# Opt level: O0

void __thiscall gui::TextBox::~TextBox(TextBox *this)

{
  Widget *in_RDI;
  
  (in_RDI->super_Drawable)._vptr_Drawable = (_func_int **)&PTR__TextBox_004801e8;
  sf::String::~String((String *)0x28ff1d);
  sf::String::~String((String *)0x28ff2e);
  sf::String::~String((String *)0x28ff3f);
  std::shared_ptr<gui::TextBoxStyle>::~shared_ptr((shared_ptr<gui::TextBoxStyle> *)0x28ff50);
  Signal<gui::Widget_*,_const_sf::String_&>::~Signal
            ((Signal<gui::Widget_*,_const_sf::String_&> *)0x28ff61);
  Signal<gui::Widget_*,_const_sf::String_&>::~Signal
            ((Signal<gui::Widget_*,_const_sf::String_&> *)0x28ff72);
  Signal<gui::Widget_*,_const_sf::Vector2<float>_&>::~Signal
            ((Signal<gui::Widget_*,_const_sf::Vector2<float>_&> *)0x28ff83);
  Signal<gui::Widget_*,_sf::Mouse::Button,_const_sf::Vector2<float>_&>::~Signal
            ((Signal<gui::Widget_*,_sf::Mouse::Button,_const_sf::Vector2<float>_&> *)0x28ff94);
  Signal<gui::Widget_*,_sf::Mouse::Button,_const_sf::Vector2<float>_&>::~Signal
            ((Signal<gui::Widget_*,_sf::Mouse::Button,_const_sf::Vector2<float>_&> *)0x28ffa5);
  Widget::~Widget(in_RDI);
  return;
}

Assistant:

virtual ~TextBox() = default;